

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

sendContext * __thiscall
hwnet::sendContextPool::get(sendContextPool *this,int fd,Ptr *buff,size_t len)

{
  int iVar1;
  sendContext *s_1;
  sendContext *s;
  void *m;
  lock_guard<std::mutex> guard;
  pool *p;
  int index;
  size_t len_local;
  Ptr *buff_local;
  int fd_local;
  sendContextPool *this_local;
  
  iVar1 = fd % 0x101;
  guard._M_device = &this->pools[iVar1].mtx;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&m,guard._M_device);
  if (*(long *)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) == 0) {
    this_local = (sendContextPool *)malloc(0x30);
    TCPSocket::sendContext::sendContext((sendContext *)this_local,buff,len);
    ((sendContext *)this_local)->poolIndex = iVar1;
  }
  else {
    guard._M_device[1].super___mutex_base._M_mutex.__data.__lock =
         guard._M_device[1].super___mutex_base._M_mutex.__data.__lock + -1;
    this_local = *(sendContextPool **)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8);
    *(undefined8 *)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) =
         *(undefined8 *)
          (*(long *)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) + 0x20);
    TCPSocket::sendContext::sendContext((sendContext *)this_local,buff,len);
    ((sendContext *)this_local)->poolIndex = iVar1;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&m);
  return (sendContext *)this_local;
}

Assistant:

TCPSocket::sendContext* get(int fd,const Buffer::Ptr &buff,size_t len) {
		auto index = fd%poolCount;
		pool &p = this->pools[index]; 
		std::lock_guard<std::mutex> guard(p.mtx);
		if(nullptr == p.head) {
			auto m = malloc(sizeof(TCPSocket::sendContext));
			auto s = new(m)TCPSocket::sendContext(buff,len);
			s->poolIndex = index;
			return s;
		} else {
			--p.count;
			auto s = p.head;
			p.head = p.head->next;
			s = new(s)TCPSocket::sendContext(buff,len);
			s->poolIndex = index;
			return s;
		}
	}